

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_WheelDD::RS_WheelDD
          (RS_WheelDD *this,string *name,int id,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system)

{
  shared_ptr<chrono::ChBodyAuxRef> *__r;
  undefined8 uVar1;
  ChFrame *pCVar2;
  undefined1 auVar3 [16];
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> a_Stack_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ChVector<double> local_f8;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b8;
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_148,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  RS_Part::RS_Part(&this->super_RS_Part,name,(shared_ptr<chrono::ChMaterialSurface> *)&local_148,
                   system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_Part_0019fa18;
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  local_f8.m_data[2] = 0.0;
  local_128 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_118 = 0x3f847ae147ae147b;
  uStack_110 = 0x3f847ae147ae147b;
  local_108 = 0x3f947ae147ae147b;
  *(int *)((this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28) = id;
  chrono::ChVariablesBodyOwnMass::SetBodyMass(3.4925);
  __r = &(this->super_RS_Part).m_body;
  pCVar2 = (ChFrame *)
           (__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d8.m_data[0] = 1.0;
  local_d8.m_data[3] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_d8.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_b8,&local_f8,&local_d8);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar2);
  chrono::ChBody::SetInertiaXX
            ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  chrono::ChBody::SetInertiaXY
            ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (a_Stack_158,&__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)
  ;
  chrono::ChSystem::Add(system,a_Stack_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
  chrono::Q_from_AngX(1.5707963267948966);
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)0x0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[2] = local_d8.m_data[0];
  local_b8.coord.rot.m_data[0] = local_d8.m_data[1];
  local_b8.coord.rot.m_data[1] = local_d8.m_data[2];
  local_b8.coord.rot.m_data[2] = local_d8.m_data[3];
  local_b8.coord.rot.m_data[3] = 0.074;
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.038;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>
            (&(this->super_RS_Part).m_cylinders,(CylinderShape *)&local_b8);
  std::__cxx11::string::assign((char *)&(this->super_RS_Part).m_mesh_name);
  auVar3._8_4_ = 0x3e99999a;
  auVar3._0_8_ = 0x3e99999a3e99999a;
  auVar3._12_4_ = 0x3e99999a;
  (this->super_RS_Part).m_offset.m_data[2] = 0.0;
  (this->super_RS_Part).m_offset.m_data[0] = 0.0;
  (this->super_RS_Part).m_offset.m_data[1] = 0.0;
  uVar1 = vmovlps_avx(auVar3);
  (this->super_RS_Part).m_color.R = (float)(int)uVar1;
  (this->super_RS_Part).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_RS_Part).m_color.B = 0.3;
  return;
}

Assistant:

RS_WheelDD::RS_WheelDD(const std::string& name, int id, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system) {
    double mass = 3.492500;
    ChVector<> com(0, 0, 0);
    ChVector<> inertia_xx(0.01, 0.01, 0.02);
    ChVector<> inertia_xy(0, 0, 0);

    m_body->SetIdentifier(id);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    system->Add(m_body);

    m_cylinders.push_back(CylinderShape(ChVector<>(0, 0, 0), Q_from_AngX(CH_C_PI_2), 0.074, 0.038));

    m_mesh_name = "robosim_dd_wheel";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.3f, 0.3f, 0.3f);
}